

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

string * utilSolutionStatusToString_abi_cxx11_(HighsInt solution_status)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"None",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Infeasible",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Feasible",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unrecognised solution status",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  return in_RDI;
}

Assistant:

std::string utilSolutionStatusToString(const HighsInt solution_status) {
  switch (solution_status) {
    case kSolutionStatusNone:
      return "None";
      break;
    case kSolutionStatusInfeasible:
      return "Infeasible";
      break;
    case kSolutionStatusFeasible:
      return "Feasible";
      break;
    default:
      assert(1 == 0);
      return "Unrecognised solution status";
  }
}